

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

void printarrayblock(LispPTR base)

{
  ushort *puVar1;
  DLword *pDVar2;
  DLword *pDVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = (ulong)base;
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar7);
  }
  pDVar2 = Lisp_world;
  uVar5 = (base + (uint)Lisp_world[uVar7] * 2) - 2;
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
  }
  pDVar3 = Lisp_world;
  puVar1 = pDVar2 + uVar7;
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(base - 2));
  }
  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n",uVar7,
         (ulong)(base + (uint)Lisp_world[base - 2] * -2),(ulong)(base + (uint)*puVar1 * 2));
  printf("          Length: %d cells.\n\n",(ulong)*puVar1);
  puVar4 = (uint *)(puVar1 + -0x28);
  lVar6 = -0x54;
  do {
    printf("%16p %8x\n",puVar4,(ulong)*puVar4);
    puVar4 = puVar4 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar6 < -4);
  printf("%16p %8x <- array header\n",puVar4,(ulong)*puVar4);
  lVar6 = 4;
  do {
    printf("%16p %8x\n",(long)puVar1 + lVar6,(ulong)*(uint *)((long)puVar1 + lVar6));
    uVar7 = lVar6 - 4;
    lVar6 = lVar6 + 4;
  } while (uVar7 < 0x48);
  puts(". . .");
  puVar4 = (uint *)(pDVar3 + ((ulong)uVar5 - 0x28));
  lVar6 = -0x54;
  do {
    printf("%16p %8x\n",puVar4,(ulong)*puVar4);
    puVar4 = puVar4 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar6 < -4);
  printf("%16p %8x <- array trailer\n",puVar4,(ulong)*puVar4);
  lVar6 = 4;
  do {
    printf("%16p %8x\n",(long)pDVar3 + lVar6 + (ulong)uVar5 * 2,
           (ulong)*(uint *)((long)pDVar3 + lVar6 + (ulong)uVar5 * 2));
    uVar7 = lVar6 - 4;
    lVar6 = lVar6 + 4;
  } while (uVar7 < 0x48);
  return;
}

Assistant:

void printarrayblock(LispPTR base) {
  struct arrayblock *bbase, *btrailer, *ptrailer;
  LispPTR *addr;

  LispPTR pbase, nbase;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  btrailer = (struct arrayblock *)NativeAligned4FromLAddr(Trailer(base, bbase));
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);

  nbase = base + 2 * bbase->arlen;
  pbase = base - 2 * ptrailer->arlen;

  printf("This array block: 0x%x.  Previous: 0x%x.  Next: 0x%x.\n", base, pbase, nbase);
  printf("          Length: %d cells.\n\n", bbase->arlen);

  addr = ((LispPTR *)bbase) - 20;
  for (; addr < (LispPTR *)bbase; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array header\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)bbase + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf(". . .\n");

  addr = ((LispPTR *)btrailer) - 20;
  for (; addr < (LispPTR *)btrailer; addr++) printf("%16p %8x\n", (void *)addr, *addr);
  printf("%16p %8x <- array trailer\n", (void *)addr, *addr);
  addr++;
  for (; addr < (LispPTR *)btrailer + 20; addr++) printf("%16p %8x\n", (void *)addr, *addr);
}